

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManyToOneRingBuffer.h
# Opt level: O3

void __thiscall
aeron::concurrent::ringbuffer::ManyToOneRingBuffer::ManyToOneRingBuffer
          (ManyToOneRingBuffer *this,AtomicBuffer *buffer)

{
  char *pcVar1;
  uint __val;
  length_t lVar2;
  SourcedException *this_00;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this->m_buffer = buffer;
  lVar2 = buffer->m_length;
  __val = lVar2 - 0x300;
  this->m_capacity = __val;
  if ((0x300 < (int)lVar2) && ((lVar2 + 0x7ffffcff & __val) == 0)) {
    this->m_maxMsgLength = __val >> 3;
    this->m_headPositionIndex = lVar2 - 0x180;
    this->m_headCachePositionIndex = lVar2 - 0x200;
    this->m_tailPositionIndex = lVar2 - 0x280;
    this->m_correlationIdCounterIndex = lVar2 - 0x100;
    this->m_consumerHeartbeatIndex = lVar2 - 0x80;
    return;
  }
  this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_68,__val);
  std::operator+(&local_48,"Capacity must be a positive power of 2 + TRAILER_LENGTH: capacity=",
                 &local_68);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "void aeron::concurrent::ringbuffer::RingBufferDescriptor::checkCapacity(util::index_t)"
             ,"");
  pcVar5 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/ringbuffer/RingBufferDescriptor.h"
  ;
  pcVar3 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
  do {
    pcVar3 = pcVar3 + 1;
    pcVar1 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
  } while (*pcVar3 == *pcVar1);
  pcVar5 = pcVar5 + (*pcVar1 == '/');
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  sVar4 = strlen(pcVar5);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,pcVar5,pcVar5 + sVar4);
  util::SourcedException::SourcedException(this_00,&local_48,&local_88,&local_a8,0x32);
  *(undefined ***)this_00 = &PTR__SourcedException_00163440;
  __cxa_throw(this_00,&util::IllegalArgumentException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

ManyToOneRingBuffer(concurrent::AtomicBuffer& buffer) :
        m_buffer(buffer)
    {
        m_capacity = buffer.capacity() - RingBufferDescriptor::TRAILER_LENGTH;

        RingBufferDescriptor::checkCapacity(m_capacity);

        m_maxMsgLength = m_capacity / 8;

        m_tailPositionIndex = m_capacity + RingBufferDescriptor::TAIL_POSITION_OFFSET;
        m_headCachePositionIndex = m_capacity + RingBufferDescriptor::HEAD_CACHE_POSITION_OFFSET;
        m_headPositionIndex = m_capacity + RingBufferDescriptor::HEAD_POSITION_OFFSET;
        m_correlationIdCounterIndex = m_capacity + RingBufferDescriptor::CORRELATION_COUNTER_OFFSET;
        m_consumerHeartbeatIndex = m_capacity + RingBufferDescriptor::CONSUMER_HEARTBEAT_OFFSET;
    }